

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void __thiscall
LowererMD::GenerateWriteBarrierAssign
          (LowererMD *this,IndirOpnd *opndDst,Opnd *opndSrc,Instr *insertBeforeInstr)

{
  bool bVar1;
  RegOpnd *baseOpnd;
  Instr *pIVar2;
  IndirOpnd *dstOpnd;
  Instr *movInstr;
  RegOpnd *writeBarrierAddrRegOpnd;
  Instr *insertBeforeInstr_local;
  Opnd *opndSrc_local;
  IndirOpnd *opndDst_local;
  LowererMD *this_local;
  
  bVar1 = IR::Opnd::IsWriteBarrierTriggerableValue(opndSrc);
  if (bVar1) {
    baseOpnd = IR::RegOpnd::New(TyUint64,insertBeforeInstr->m_func);
    pIVar2 = IR::Instr::New(LEA,&baseOpnd->super_Opnd,&opndDst->super_Opnd,insertBeforeInstr->m_func
                           );
    IR::Instr::InsertBefore(insertBeforeInstr,pIVar2);
    dstOpnd = IR::IndirOpnd::New(baseOpnd,0,TyInt64,insertBeforeInstr->m_func,false);
    pIVar2 = IR::Instr::New(MOV,&dstOpnd->super_Opnd,opndSrc,insertBeforeInstr->m_func);
    IR::Instr::InsertBefore(insertBeforeInstr,pIVar2);
    GenerateWriteBarrier(pIVar2);
  }
  else {
    Lowerer::InsertMove(&opndDst->super_Opnd,opndSrc,insertBeforeInstr,true);
  }
  return;
}

Assistant:

void
LowererMD::GenerateWriteBarrierAssign(IR::IndirOpnd * opndDst, IR::Opnd * opndSrc, IR::Instr * insertBeforeInstr)
{
#ifdef RECYCLER_WRITE_BARRIER_JIT
    if (opndSrc->IsWriteBarrierTriggerableValue())
    {
        IR::RegOpnd * writeBarrierAddrRegOpnd = IR::RegOpnd::New(TyMachPtr, insertBeforeInstr->m_func);
        insertBeforeInstr->InsertBefore(IR::Instr::New(Js::OpCode::LEA, writeBarrierAddrRegOpnd, opndDst, insertBeforeInstr->m_func));

        IR::Instr* movInstr = IR::Instr::New(Js::OpCode::MOV,
            IR::IndirOpnd::New(writeBarrierAddrRegOpnd, 0, TyMachReg, insertBeforeInstr->m_func), opndSrc, insertBeforeInstr->m_func);
        insertBeforeInstr->InsertBefore(movInstr);
        GenerateWriteBarrier(movInstr);

        // The mov happens above, and it's slightly faster doing it that way since we've already calculated the address we're writing to
        return;
    }
#endif
    Lowerer::InsertMove(opndDst, opndSrc, insertBeforeInstr);
    return;
}